

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

ImRect __thiscall ImGuiWindow::MenuBarRect(ImGuiWindow *this)

{
  long in_RDI;
  float fVar1;
  float x1;
  float y1;
  float in_stack_ffffffffffffffd0;
  float x2;
  undefined4 in_stack_ffffffffffffffe0;
  float fVar2;
  undefined4 in_stack_ffffffffffffffe4;
  float fVar3;
  undefined1 local_10 [16];
  
  x2 = *(float *)(in_RDI + 0x1c);
  fVar1 = TitleBarHeight((ImGuiWindow *)
                         CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  fVar1 = x2 + fVar1;
  fVar2 = *(float *)(in_RDI + 0x18);
  x1 = fVar2 + *(float *)(in_RDI + 0x28);
  fVar3 = fVar1;
  MenuBarHeight((ImGuiWindow *)CONCAT44(fVar1,fVar2));
  ImRect::ImRect((ImRect *)CONCAT44(fVar3,fVar2),x1,fVar1,x2,in_stack_ffffffffffffffd0);
  return (ImRect)local_10;
}

Assistant:

ImRect      MenuBarRect() const     { float y1 = Pos.y + TitleBarHeight(); return ImRect(Pos.x, y1, Pos.x + SizeFull.x, y1 + MenuBarHeight()); }